

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O0

void dtl_json_writer_decreaseIndent(dtl_json_writer_t *self)

{
  int iVar1;
  long lVar2;
  dtl_json_writer_t *self_local;
  
  if (0 < self->indentWidth) {
    if (self->indentWidth < self->currentIndent) {
      self->currentIndent = self->currentIndent - self->indentWidth;
    }
    else {
      self->currentIndent = 0;
    }
    if (self->indentArray == (adt_bytearray_t *)0x0) {
      __assert_fail("self->indentArray != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_writer.c"
                    ,0xe6,"void dtl_json_writer_decreaseIndent(dtl_json_writer_t *)");
    }
    iVar1 = adt_bytearray_length(self->indentArray);
    if (iVar1 <= self->currentIndent) {
      __assert_fail("(int32_t) adt_bytearray_length(self->indentArray) > self->currentIndent",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_writer.c"
                    ,0xe7,"void dtl_json_writer_decreaseIndent(dtl_json_writer_t *)");
    }
    lVar2 = adt_bytearray_data(self->indentArray);
    *(undefined1 *)(lVar2 + self->currentIndent) = 0;
  }
  return;
}

Assistant:

static void dtl_json_writer_decreaseIndent(dtl_json_writer_t *self)
{
   if (self->indentWidth > 0)
   {
      if (self->currentIndent > self->indentWidth)
      {
         self->currentIndent -= self->indentWidth;
      }
      else
      {
         self->currentIndent = 0;
      }
      assert(self->indentArray != 0);
      assert( (int32_t) adt_bytearray_length(self->indentArray) > self->currentIndent);
      adt_bytearray_data(self->indentArray)[self->currentIndent] = 0u;
   }
}